

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O1

Input * __thiscall
helics::ValueFederateManager::registerInput
          (ValueFederateManager *this,string_view key,string_view type,string_view units)

{
  Input **ppIVar1;
  string_view typeName;
  reference pvVar2;
  HelicsException *this_00;
  long lVar3;
  Input *pIVar4;
  string_view searchValue1;
  string_view message;
  _Optional_base<unsigned_long,_true,_true> _Var5;
  handle datHandle;
  handle inpHandle;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  InterfaceHandle local_74;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  string_view local_60;
  handle local_50;
  handle local_38;
  
  local_70._M_str = key._M_str;
  local_70._M_len = key._M_len;
  if (this->useJsonSerialization == false) {
    typeName._M_len._4_4_ = in_stack_ffffffffffffff7c;
    typeName._M_len._0_4_ = in_stack_ffffffffffffff78;
    typeName._M_str._0_4_ = in_stack_ffffffffffffff80;
    typeName._M_str._4_4_ = in_stack_ffffffffffffff84;
    local_60 = type;
    local_60 = getCleanedTypeName(typeName);
  }
  else {
    local_60._M_str = "json";
    local_60._M_len = 4;
  }
  local_74.hid = (*this->coreObject->_vptr_Core[0x26])
                           (this->coreObject,(ulong)(uint)(this->fedID).fid,local_70._M_len,
                            local_70._M_str,local_60._M_len,local_60._M_str,(undefined4)units._M_len
                            ,units._M_str._0_4_);
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Input,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::mutex>
  ::lock(&local_38,&this->inputs);
  if (local_70._M_len == 0) {
    _Var5._M_payload.super__Optional_payload_base<unsigned_long> =
         (_Optional_payload<unsigned_long,_true,_true,_true>)
         gmlc::containers::
         DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>::
         insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                   ((DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>
                     *)local_38.data,&local_74,&this->fed,&local_74,&local_70,&units);
  }
  else {
    searchValue1._M_str = local_70._M_str;
    searchValue1._M_len = local_70._M_len;
    _Var5._M_payload.super__Optional_payload_base<unsigned_long> =
         (_Optional_payload<unsigned_long,_true,_true,_true>)
         gmlc::containers::
         DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>::
         insert<helics::ValueFederate*&,helics::InterfaceHandle&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                   ((DualStringMappedVector<helics::Input,helics::InterfaceHandle,(reference_stability)0,5>
                     *)local_38.data,searchValue1,&local_74,&this->fed,&local_74,&local_70,&units);
  }
  if (((undefined1  [16])_Var5._M_payload.super__Optional_payload_base<unsigned_long> &
      (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    lVar3 = (long)((local_38.data)->dataStorage).bsize;
    ppIVar1 = ((local_38.data)->dataStorage).dataptr;
    if (lVar3 == 0) {
      pIVar4 = ppIVar1[(((local_38.data)->dataStorage).csize >> 5) - 1] + 0x1f;
    }
    else {
      pIVar4 = ppIVar1[((local_38.data)->dataStorage).dataSlotIndex] + lVar3 + -1;
    }
    gmlc::libguarded::
    shared_guarded_opt<std::deque<helics::InputData,_std::allocator<helics::InputData>_>,_std::shared_mutex>
    ::lock(&local_50,&this->inputData);
    pvVar2 = std::deque<helics::InputData,std::allocator<helics::InputData>>::
             emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
                       ((deque<helics::InputData,std::allocator<helics::InputData>> *)local_50.data,
                        &local_70,&local_60,&units);
    pIVar4->dataReference = pvVar2;
    local_50.data = (pointer)0x0;
    if (local_50.m_handle_lock._M_owns == true) {
      std::unique_lock<std::shared_mutex>::unlock(&local_50.m_handle_lock);
    }
    pIVar4->referenceIndex =
         _Var5._M_payload.super__Optional_payload_base<unsigned_long>._M_payload._0_4_;
    if (this->useJsonSerialization == true) {
      pIVar4->targetType = HELICS_JSON;
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_50.m_handle_lock);
    std::unique_lock<std::mutex>::~unique_lock(&local_38.m_handle_lock);
    return pIVar4;
  }
  this_00 = (HelicsException *)__cxa_allocate_exception(0x28);
  message._M_str = "Unable to register Input";
  message._M_len = 0x18;
  HelicsException::HelicsException(this_00,message);
  *(undefined ***)this_00 = &PTR__HelicsException_004da6d8;
  __cxa_throw(this_00,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
}

Assistant:

Input& ValueFederateManager::registerInput(std::string_view key,
                                           std::string_view type,
                                           std::string_view units)
{
    type = useJsonSerialization ? jsonStringType : getCleanedTypeName(type);
    auto coreID = coreObject->registerInput(fedID, key, type, units);
    auto inpHandle = inputs.lock();
    decltype(inpHandle->insert(key, coreID, fed, coreID, key, units)) active;
    if (!key.empty()) {
        active = inpHandle->insert(key, coreID, fed, coreID, key, units);
    } else {
        active = inpHandle->insert(no_search, coreID, fed, coreID, key, units);
    }
    if (active) {
        auto& ref = inpHandle->back();
        auto datHandle = inputData.lock();
        auto& idat = datHandle->emplace_back(key, type, units);

        // non-owning pointer
        ref.dataReference = &idat;
        datHandle.unlock();
        ref.referenceIndex = static_cast<int>(*active);
        if (useJsonSerialization) {
            ref.targetType = DataType::HELICS_JSON;
        }
        return ref;
    }
    throw(RegistrationFailure("Unable to register Input"));
}